

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::
    make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,cs::numeric_const&>
              (numeric *args,numeric *args_1,numeric *args_2)

{
  holder<cs::range_type> *args_1_00;
  proxy *dat;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RCX;
  numeric *in_RDI;
  numeric *args_2_00;
  numeric *in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  undefined4 uVar2;
  
  uVar2 = 2;
  uVar1 = 1;
  args_2_00 = in_RDI;
  args_1_00 = cs::
              allocator_type<cs_impl::any::holder<cs::range_type>,64ul,cs_impl::default_allocator_provider>
              ::alloc<cs::numeric_const&,cs::numeric_const&,cs::numeric_const&>
                        ((allocator_type<cs_impl::any::holder<cs::range_type>,_64UL,_cs_impl::default_allocator_provider>
                          *)in_RCX,(numeric *)0x200000001,in_stack_ffffffffffffffd0,in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<cs::range_type>*>
                  (in_RCX,(int *)CONCAT44(uVar2,uVar1),(int *)args_1_00,
                   (holder<cs::range_type> **)args_2_00);
  any((any *)in_RDI,dat);
  return (any)(proxy *)args_2_00;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}